

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O1

bool __thiscall
ON_2dVector::IsPerpendicularTo(ON_2dVector *this,ON_2dVector *v,double angle_tolerance)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  
  dVar3 = ABS(this->x);
  dVar5 = ABS(this->y);
  dVar7 = dVar5;
  if (dVar5 <= dVar3) {
    dVar7 = dVar3;
  }
  if (dVar7 <= 2.2250738585072014e-308) {
    if (dVar7 <= 0.0) {
      dVar7 = 0.0;
    }
  }
  else {
    if (dVar5 <= dVar3) {
      dVar3 = dVar5;
    }
    dVar3 = (dVar3 / dVar7) * (dVar3 / dVar7) + 1.0;
    if (dVar3 < 0.0) {
      dVar3 = sqrt(dVar3);
    }
    else {
      dVar3 = SQRT(dVar3);
    }
    dVar7 = dVar7 * dVar3;
  }
  dVar3 = ABS(v->x);
  dVar6 = ABS(v->y);
  dVar5 = dVar6;
  if (dVar6 <= dVar3) {
    dVar5 = dVar3;
  }
  if (dVar5 <= 2.2250738585072014e-308) {
    if (dVar5 <= 0.0) {
      dVar5 = 0.0;
    }
  }
  else {
    if (dVar6 <= dVar3) {
      dVar3 = dVar6;
    }
    dVar3 = (dVar3 / dVar5) * (dVar3 / dVar5) + 1.0;
    if (dVar3 < 0.0) {
      dVar3 = sqrt(dVar3);
    }
    else {
      dVar3 = SQRT(dVar3);
    }
    dVar5 = dVar5 * dVar3;
  }
  if ((0.0 < dVar7 * dVar5) &&
     (dVar3 = this->x, dVar6 = this->y, dVar1 = v->y, dVar2 = v->x, dVar4 = sin(angle_tolerance),
     ABS((dVar3 * dVar2 + dVar6 * dVar1) / (dVar7 * dVar5)) <= dVar4)) {
    return true;
  }
  return false;
}

Assistant:

bool ON_2dVector::IsPerpendicularTo(
      // returns true:  this and other vectors are perpendicular
      //         false: this and other vectors are not perpendicular
      //                or at least one of the vectors is zero
      const ON_2dVector& v,
      double angle_tolerance // (default=ON_DEFAULT_ANGLE_TOLERANCE) radians
      ) const
{
  bool rc = false;
  const double ll = Length()*v.Length();
  if ( ll > 0.0 ) {
    if ( fabs((x*v.x + y*v.y)/ll) <= sin(angle_tolerance) )
      rc = true;
  }
  return rc;
}